

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_CalcHeight(player_t *player)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if ((player->cheats & 0x40000000) == 0) {
    if ((((player->mo->super_AActor).flags.Value & 0x200) != 0) && (player->onground == false)) {
      player->bob = 0.5;
      dVar5 = 0.5;
      goto LAB_004ec1b0;
    }
    dVar5 = (player->Vel).X;
    dVar6 = (player->Vel).Y;
    dVar5 = dVar6 * dVar6 + dVar5 * dVar5;
    player->bob = dVar5;
    bVar2 = true;
    if ((dVar5 != 0.0) || (NAN(dVar5))) {
      dVar5 = userinfo_t::GetMoveBob(&player->userinfo);
      dVar5 = dVar5 * player->bob;
      player->bob = dVar5;
      if (16.0 < dVar5) {
        player->bob = 16.0;
        dVar5 = 16.0;
      }
      goto LAB_004ec1b0;
    }
  }
  else {
    player->bob = 0.0;
    dVar5 = 0.0;
LAB_004ec1b0:
    bVar2 = false;
  }
  pAVar1 = player->mo;
  dVar6 = pAVar1->ViewHeight + player->crouchviewdelta;
  if ((player->cheats & 4) != 0) {
    dVar6 = dVar6 + (pAVar1->super_AActor).__Pos.Z;
    player->viewz = dVar6;
    dVar5 = (pAVar1->super_AActor).ceilingz + -4.0;
    if (dVar6 <= dVar5) {
      return;
    }
    goto LAB_004ec3f8;
  }
  if (bVar2) {
    if (player->health < 1) {
      dVar4 = 0.0;
    }
    else {
      dVar5 = (double)level.time;
      dVar3 = userinfo_t::GetStillBob(&player->userinfo);
      dVar4 = fastsindeg((dVar5 / 120.0) * 360.0);
      dVar4 = dVar4 * dVar3;
    }
  }
  else {
    dVar4 = fastsindeg(((double)level.time / 20.0) * 360.0);
    dVar4 = dVar5 * dVar4 *
            *(double *)(&DAT_0069ba40 + (ulong)(1 < (player->mo->super_AActor).waterlevel) * 8);
  }
  if (player->playerstate == '\0') {
    dVar5 = player->deltaviewheight;
    dVar3 = player->viewheight + dVar5;
    player->viewheight = dVar3;
    if (dVar3 <= dVar6) {
      dVar6 = dVar6 * 0.5;
      if ((dVar6 <= dVar3) || (player->viewheight = dVar6, dVar3 = dVar6, 0.0 < dVar5)) {
        dVar6 = dVar3;
        if ((dVar5 == 0.0) && (!NAN(dVar5))) goto LAB_004ec372;
      }
      else {
        dVar5 = 1.52587890625e-05;
      }
      dVar5 = dVar5 + 0.25;
      player->deltaviewheight = dVar5;
      dVar3 = dVar6;
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        player->deltaviewheight = 1.52587890625e-05;
      }
    }
    else {
      player->viewheight = dVar6;
      player->deltaviewheight = 0.0;
      dVar3 = dVar6;
    }
  }
  else {
    dVar3 = player->viewheight;
  }
LAB_004ec372:
  if (player->morphTics != 0) {
    dVar4 = 0.0;
  }
  pAVar1 = player->mo;
  dVar5 = (pAVar1->super_AActor).__Pos.Z;
  dVar4 = dVar3 + dVar5 + dVar4;
  player->viewz = dVar4;
  if (player->playerstate != '\x01') {
    dVar6 = (pAVar1->super_AActor).Floorclip;
    if (((dVar6 != 0.0) || (NAN(dVar6))) && (dVar5 <= (pAVar1->super_AActor).floorz)) {
      dVar4 = dVar4 - dVar6;
      player->viewz = dVar4;
    }
  }
  dVar5 = (pAVar1->super_AActor).ceilingz + -4.0;
  if (dVar5 < dVar4) {
    player->viewz = dVar5;
    dVar4 = dVar5;
  }
  dVar5 = (pAVar1->super_AActor).floorz + 4.0;
  if (dVar5 <= dVar4) {
    return;
  }
LAB_004ec3f8:
  player->viewz = dVar5;
  return;
}

Assistant:

void P_CalcHeight (player_t *player) 
{
	DAngle		angle;
	double	 	bob;
	bool		still = false;

	// Regular movement bobbing
	// (needs to be calculated for gun swing even if not on ground)

	// killough 10/98: Make bobbing depend only on player-applied motion.
	//
	// Note: don't reduce bobbing here if on ice: if you reduce bobbing here,
	// it causes bobbing jerkiness when the player moves from ice to non-ice,
	// and vice-versa.

	if (player->cheats & CF_NOCLIP2)
	{
		player->bob = 0;
	}
	else if ((player->mo->flags & MF_NOGRAVITY) && !player->onground)
	{
		player->bob = 0.5;
	}
	else
	{
		player->bob = player->Vel.LengthSquared();
		if (player->bob == 0)
		{
			still = true;
		}
		else
		{
			player->bob *= player->userinfo.GetMoveBob();

			if (player->bob > MAXBOB)
				player->bob = MAXBOB;
		}
	}

	double defaultviewheight = player->mo->ViewHeight + player->crouchviewdelta;

	if (player->cheats & CF_NOVELOCITY)
	{
		player->viewz = player->mo->Z() + defaultviewheight;

		if (player->viewz > player->mo->ceilingz-4)
			player->viewz = player->mo->ceilingz-4;

		return;
	}

	if (still)
	{
		if (player->health > 0)
		{
			angle = level.time / (120 * TICRATE / 35.) * 360.;
			bob = player->userinfo.GetStillBob() * angle.Sin();
		}
		else
		{
			bob = 0;
		}
	}
	else
	{
		angle = level.time / (20 * TICRATE / 35.) * 360.;
		bob = player->bob * angle.Sin() * (player->mo->waterlevel > 1 ? 0.25f : 0.5f);
	}

	// move viewheight
	if (player->playerstate == PST_LIVE)
	{
		player->viewheight += player->deltaviewheight;

		if (player->viewheight > defaultviewheight)
		{
			player->viewheight = defaultviewheight;
			player->deltaviewheight = 0;
		}
		else if (player->viewheight < (defaultviewheight/2))
		{
			player->viewheight = defaultviewheight/2;
			if (player->deltaviewheight <= 0)
				player->deltaviewheight = 1 / 65536.;
		}
		
		if (player->deltaviewheight)	
		{
			player->deltaviewheight += 0.25;
			if (!player->deltaviewheight)
				player->deltaviewheight = 1/65536.;
		}
	}

	if (player->morphTics)
	{
		bob = 0;
	}
	player->viewz = player->mo->Z() + player->viewheight + bob;
	if (player->mo->Floorclip && player->playerstate != PST_DEAD
		&& player->mo->Z() <= player->mo->floorz)
	{
		player->viewz -= player->mo->Floorclip;
	}
	if (player->viewz > player->mo->ceilingz - 4)
	{
		player->viewz = player->mo->ceilingz - 4;
	}
	if (player->viewz < player->mo->floorz + 4)
	{
		player->viewz = player->mo->floorz + 4;
	}
}